

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O3

UBool __thiscall icu_63::FieldPositionIterator::next(FieldPositionIterator *this,FieldPosition *fp)

{
  uint uVar1;
  int iVar2;
  UVector32 *pUVar3;
  UBool UVar4;
  uint uVar6;
  ulong uVar7;
  int32_t iVar8;
  int32_t iVar5;
  
  uVar1 = this->pos;
  uVar7 = (ulong)uVar1;
  UVar4 = '\0';
  iVar5 = 0;
  if (uVar7 != 0xffffffff) {
    pUVar3 = this->data;
    this->pos = uVar1 + 1;
    if ((-1 < (int)uVar1) && ((int)uVar1 < pUVar3->count)) {
      iVar5 = pUVar3->elements[uVar7];
    }
    fp->fField = iVar5;
    uVar6 = uVar1 + 2;
    this->pos = uVar6;
    iVar8 = 0;
    iVar5 = 0;
    if ((-2 < (int)uVar1) && ((int)(uVar1 + 1) < pUVar3->count)) {
      iVar5 = pUVar3->elements[uVar7 + 1];
    }
    fp->fBeginIndex = iVar5;
    this->pos = uVar1 + 3;
    iVar2 = pUVar3->count;
    if ((int)uVar6 < iVar2 && -3 < (int)uVar1) {
      iVar8 = pUVar3->elements[uVar6];
    }
    fp->fEndIndex = iVar8;
    UVar4 = '\x01';
    if (uVar1 + 3 == iVar2) {
      this->pos = -1;
    }
  }
  return UVar4;
}

Assistant:

UBool FieldPositionIterator::next(FieldPosition& fp) {
  if (pos == -1) {
    return FALSE;
  }

  fp.setField(data->elementAti(pos++));
  fp.setBeginIndex(data->elementAti(pos++));
  fp.setEndIndex(data->elementAti(pos++));

  if (pos == data->size()) {
    pos = -1;
  }

  return TRUE;
}